

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O0

DSVectorBase<double> * __thiscall
soplex::DSVectorBase<double>::operator=(DSVectorBase<double> *this,DSVectorBase<double> *vec)

{
  DSVectorBase<double> *in_RSI;
  DSVectorBase<double> *in_RDI;
  
  if (in_RDI != in_RSI) {
    SVectorBase<double>::clear((SVectorBase<double> *)0x26f26b);
    SVectorBase<double>::size(&in_RSI->super_SVectorBase<double>);
    makeMem(in_RSI,(int)((ulong)in_RDI >> 0x20));
    SVectorBase<double>::operator=((SVectorBase<double> *)this,(SVectorBase<double> *)vec);
  }
  return in_RDI;
}

Assistant:

DSVectorBase<R>& operator=(const DSVectorBase<R>& vec)
   {
      if(this != &vec)
      {
         SVectorBase<R>::clear();
         makeMem(vec.size());
         SVectorBase<R>::operator=(vec);
      }

      return *this;
   }